

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptProxy::
GetPropertyTrap<Js::JavascriptProxy::GetPropertyReferenceQuery(void*,int,void**,Js::PropertyValueInfo*,Js::ScriptContext*)::__0,Js::JavascriptProxy::GetPropertyReferenceQuery(void*,int,void**,Js::PropertyValueInfo*,Js::ScriptContext*)::__1>
          (JavascriptProxy *this,Var instance,PropertyDescriptor *propertyDescriptor,
          anon_class_32_4_051f6e2a fn,anon_class_8_1_66460f8e getPropertyId,
          ScriptContext *requestContext)

{
  code *pcVar1;
  anon_class_48_6_e6283461 implicitCall;
  bool bVar2;
  PropertyId propertyId_00;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  RecyclableObject *pRVar6;
  RecyclableObject *object;
  JavascriptFunction *pJVar7;
  Var pvVar8;
  JavascriptLibrary *this_00;
  Var bValue;
  JavascriptFunction *pJVar9;
  undefined4 *puVar10;
  Var defaultAccessor;
  PropertyDescriptor targetDescriptor;
  Var getGetResult;
  Var propertyName;
  PropertyId propertyId;
  JavascriptFunction *getGetMethod;
  RecyclableObject *targetObj;
  RecyclableObject *handlerObj;
  ThreadContext *threadContext;
  ScriptContext *requestContext_local;
  PropertyDescriptor *propertyDescriptor_local;
  Var instance_local;
  JavascriptProxy *this_local;
  anon_class_8_1_66460f8e getPropertyId_local;
  TypeId local_18;
  TypeId typeId;
  
  this_local = (JavascriptProxy *)getPropertyId.propertyId;
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  pTVar5 = ScriptContext::GetThreadContext(requestContext);
  bVar2 = ThreadContext::IsDisableImplicitCall(pTVar5);
  if (bVar2) {
    ThreadContext::AddImplicitCallFlags(pTVar5,ImplicitCall_External);
    getPropertyId_local.propertyId._4_4_ = 0;
  }
  else {
    pRVar6 = MarshalHandler(this,requestContext);
    if (pRVar6 == (RecyclableObject *)0x0) {
      bVar2 = ThreadContext::RecordImplicitException(pTVar5);
      if (bVar2) {
        JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"get");
      }
      getPropertyId_local.propertyId._4_4_ = 0;
    }
    else {
      object = MarshalTarget(this,requestContext);
      pJVar7 = GetMethodHelper(this,0x198,requestContext);
      if ((pJVar7 == (JavascriptFunction *)0x0) ||
         (bVar2 = ScriptContext::IsHeapEnumInProgress(requestContext), bVar2)) {
        PropertyDescriptor::SetFromProxy(propertyDescriptor,false);
        getPropertyId_local.propertyId._4_4_ =
             GetPropertyReferenceQuery::anon_class_32_4_051f6e2a::operator()(&fn,object);
      }
      else {
        propertyId_00 =
             GetPropertyReferenceQuery::anon_class_8_1_66460f8e::operator()
                       ((anon_class_8_1_66460f8e *)&this_local);
        PropertyDescriptor::SetFromProxy(propertyDescriptor,true);
        pvVar8 = GetName(requestContext,propertyId_00);
        implicitCall.getGetMethod = pJVar7;
        implicitCall.threadContext = pTVar5;
        implicitCall.handlerObj = pRVar6;
        implicitCall.targetObj = object;
        implicitCall.propertyName = pvVar8;
        implicitCall.instance = instance;
        targetDescriptor._40_8_ = pTVar5;
        pvVar8 = ThreadContext::
                 ExecuteImplicitCall<Js::JavascriptProxy::GetPropertyTrap<Js::JavascriptProxy::GetPropertyReferenceQuery(void*,int,void**,Js::PropertyValueInfo*,Js::ScriptContext*)::__0,Js::JavascriptProxy::GetPropertyReferenceQuery(void*,int,void**,Js::PropertyValueInfo*,Js::ScriptContext*)::__1>(void*,Js::PropertyDescriptor*,Js::JavascriptProxy::GetPropertyReferenceQuery(void*,int,void**,Js::PropertyValueInfo*,Js::ScriptContext*)::__0,Js::JavascriptProxy::GetPropertyReferenceQuery(void*,int,void**,Js::PropertyValueInfo*,Js::ScriptContext*)::__1,Js::ScriptContext*)::_lambda()_1_>
                           (pTVar5,(RecyclableObject *)pJVar7,ImplicitCall_Accessor,implicitCall);
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&defaultAccessor);
        this_00 = ScriptContext::GetLibrary(requestContext);
        pJVar7 = JavascriptLibrary::GetDefaultAccessorFunction(this_00);
        BVar3 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                          (object,propertyId_00,requestContext,
                           (PropertyDescriptor *)&defaultAccessor);
        if (BVar3 != 0) {
          Js::JavascriptOperators::CompletePropertyDescriptor
                    ((PropertyDescriptor *)&defaultAccessor,(PropertyDescriptor *)0x0,requestContext
                    );
          bVar2 = PropertyDescriptor::ValueSpecified((PropertyDescriptor *)&defaultAccessor);
          if (((!bVar2) ||
              (bVar2 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)&defaultAccessor),
              bVar2)) ||
             (bVar2 = PropertyDescriptor::IsWritable((PropertyDescriptor *)&defaultAccessor), bVar2)
             ) {
            bVar2 = PropertyDescriptor::GetterSpecified((PropertyDescriptor *)&defaultAccessor);
            if (((bVar2) ||
                (bVar2 = PropertyDescriptor::SetterSpecified((PropertyDescriptor *)&defaultAccessor)
                , bVar2)) &&
               ((bVar2 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)&defaultAccessor),
                !bVar2 && (pJVar9 = (JavascriptFunction *)
                                    PropertyDescriptor::GetGetter
                                              ((PropertyDescriptor *)&defaultAccessor),
                          pJVar9 == pJVar7)))) {
              if (pvVar8 == (Var)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 0;
              }
              bVar2 = TaggedInt::Is(pvVar8);
              if (bVar2) {
                local_18 = TypeIds_FirstNumberType;
              }
              else {
                bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar8);
                if (bVar2) {
                  local_18 = TypeIds_Number;
                }
                else {
                  pRVar6 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
                  if (pRVar6 == (RecyclableObject *)0x0) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 1;
                    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                    if (!bVar2) {
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 0;
                  }
                  local_18 = RecyclableObject::GetTypeId(pRVar6);
                  if ((0x57 < (int)local_18) &&
                     (BVar3 = RecyclableObject::IsExternal(pRVar6), BVar3 == 0)) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 1;
                    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())"
                                                ,"GetTypeId aValue has invalid TypeId");
                    if (!bVar2) {
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 0;
                  }
                }
              }
              if (local_18 != TypeIds_Undefined) {
                JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"get");
              }
            }
          }
          else {
            bValue = PropertyDescriptor::GetValue((PropertyDescriptor *)&defaultAccessor);
            bVar2 = JavascriptConversion::SameValue(pvVar8,bValue);
            if (!bVar2) {
              JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"get");
            }
          }
        }
        PropertyDescriptor::SetValue(propertyDescriptor,pvVar8);
        ThreadContext::AddImplicitCallFlags(pTVar5,ImplicitCall_External);
        getPropertyId_local.propertyId._4_4_ = 1;
      }
    }
  }
  return getPropertyId_local.propertyId._4_4_;
}

Assistant:

BOOL JavascriptProxy::GetPropertyTrap(Var instance, PropertyDescriptor* propertyDescriptor, Fn fn, GetPropertyIdFunc getPropertyId, ScriptContext* requestContext)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("get"));
        }

        RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        JavascriptFunction* getGetMethod = GetMethodHelper(PropertyIds::get, requestContext);

        if (nullptr == getGetMethod || requestContext->IsHeapEnumInProgress())
        {
            propertyDescriptor->SetFromProxy(false);
            return fn(targetObj);
        }

        PropertyId propertyId = getPropertyId();
        propertyDescriptor->SetFromProxy(true);
        Var propertyName = GetName(requestContext, propertyId);

        Var getGetResult = threadContext->ExecuteImplicitCall(getGetMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, getGetMethod, CallInfo(CallFlags_Value, 4), handlerObj, targetObj, propertyName, instance);
        });

        //    9. Let targetDesc be the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        //    10. ReturnIfAbrupt(targetDesc).
        //    11. If targetDesc is not undefined, then
        //    a.If IsDataDescriptor(targetDesc) and targetDesc.[[Configurable]] is false and targetDesc.[[Writable]] is false, then
        //        i.If SameValue(trapResult, targetDesc.[[Value]]) is false, then throw a TypeError exception.
        //    b.If IsAccessorDescriptor(targetDesc) and targetDesc.[[Configurable]] is false and targetDesc.[[Get]] is undefined, then
        //        i.If trapResult is not undefined, then throw a TypeError exception.
        //    12. Return trapResult.
        PropertyDescriptor targetDescriptor;
        Var defaultAccessor = requestContext->GetLibrary()->GetDefaultAccessorFunction();
        if (JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetDescriptor))
        {
            JavascriptOperators::CompletePropertyDescriptor(&targetDescriptor, nullptr, requestContext);
            if (targetDescriptor.ValueSpecified() && !targetDescriptor.IsConfigurable() && !targetDescriptor.IsWritable())
            {
                if (!JavascriptConversion::SameValue(getGetResult, targetDescriptor.GetValue()))
                {
                    JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("get"));
                }
            }
            else if (targetDescriptor.GetterSpecified() || targetDescriptor.SetterSpecified())
            {
                if (!targetDescriptor.IsConfigurable() &&
                    targetDescriptor.GetGetter() == defaultAccessor &&
                    JavascriptOperators::GetTypeId(getGetResult) != TypeIds_Undefined)
                {
                    JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("get"));
                }
            }
        }
        propertyDescriptor->SetValue(getGetResult);

        threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);

        return TRUE;
    }